

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

void __thiscall
CVmObjFile::alloc_ext
          (CVmObjFile *this,CVmNetFile *netfile,vm_obj_id_t charset,CVmDataSource *fp,
          unsigned_long flags,int mode,int access,int create_readbuf)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  
  (*(this->super_CVmObject)._vptr_CVmObject[2])(this,0);
  uVar3 = 0x238;
  if (create_readbuf == 0) {
    uVar3 = 0x28;
  }
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,uVar3,this);
  (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar2);
  *(CVmNetFile **)CONCAT44(extraout_var,iVar2) = netfile;
  *(CVmDataSource **)((this->super_CVmObject).ext_ + 8) = fp;
  *(vm_obj_id_t *)((this->super_CVmObject).ext_ + 0x10) = charset;
  *(unsigned_long *)((this->super_CVmObject).ext_ + 0x18) = flags;
  (this->super_CVmObject).ext_[0x14] = (char)mode;
  (this->super_CVmObject).ext_[0x15] = (char)access;
  pcVar1 = (this->super_CVmObject).ext_;
  if (create_readbuf == 0) {
    pcVar1[0x20] = '\0';
    pcVar1[0x21] = '\0';
    pcVar1[0x22] = '\0';
    pcVar1[0x23] = '\0';
    pcVar1[0x24] = '\0';
    pcVar1[0x25] = '\0';
    pcVar1[0x26] = '\0';
    pcVar1[0x27] = '\0';
  }
  else {
    *(char **)(pcVar1 + 0x20) = pcVar1 + 0x28;
    pcVar1[0x30] = '\0';
    pcVar1[0x31] = '\0';
    pcVar1[0x32] = '\0';
    pcVar1[0x33] = '\0';
    pcVar1[0x34] = '\0';
    pcVar1[0x35] = '\0';
    pcVar1[0x36] = '\0';
    pcVar1[0x37] = '\0';
    *(char **)(pcVar1 + 0x28) = pcVar1 + 0x38;
  }
  return;
}

Assistant:

void CVmObjFile::alloc_ext(VMG_ CVmNetFile *netfile,
                           vm_obj_id_t charset, CVmDataSource *fp,
                           unsigned long flags, int mode, int access,
                           int create_readbuf)
{
    /* 
     *   if we already have an extension, delete it (and release our
     *   underlying system file, if any) 
     */
    notify_delete(vmg_ FALSE);

    /* 
     *   Figure the needed size.  We need at least the standard extension;
     *   if we also need a read buffer, figure in space for that as well. 
     */
    size_t siz = sizeof(vmobjfile_ext_t);
    if (create_readbuf)
        siz += sizeof(vmobjfile_readbuf_t);

    /* allocate space for our extension structure */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(siz, this);

    /* store the data we received from the caller */
    get_ext()->netfile = netfile;
    get_ext()->fp = fp;
    get_ext()->charset = charset;
    get_ext()->flags = flags;
    get_ext()->mode = (unsigned char)mode;
    get_ext()->access = (unsigned char)access;

    /* 
     *   point to our read buffer, for which we allocated space contiguously
     *   with and immediately following our extension, if we have one 
     */
    if (create_readbuf)
    {
        /* point to our read buffer object */
        vmobjfile_readbuf_t *rb = (vmobjfile_readbuf_t *)(get_ext() + 1);
        get_ext()->readbuf = rb;

        /* initialize the read buffer with no initial data */
        rb->rem = 0;
        rb->ptr = rb->buf;
    }
    else
    {
        /* there's no read buffer at all */
        get_ext()->readbuf = 0;
    }
}